

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void EndVisitBlock(ParseNodeBlock *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  Scope *pSVar1;
  FuncInfo *this;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  bVar3 = BlockHasOwnScope(pnode,byteCodeGenerator);
  if (bVar3) {
    pSVar1 = pnode->scope;
    this = pSVar1->func;
    bVar3 = ByteCodeGenerator::IsInDebugMode(byteCodeGenerator);
    if (!bVar3) {
      bVar3 = Js::FunctionProxy::IsCoroutine(&this->byteCodeFunction->super_FunctionProxy);
      if ((!bVar3) && (pSVar1->innerScopeIndex != 0xffffffff)) {
        if (pSVar1->innerScopeIndex != this->currentInnerScopeIndex) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar4 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x80,"(scope->GetInnerScopeIndex() == func->CurrentInnerScopeIndex())"
                             ,"scope->GetInnerScopeIndex() == func->CurrentInnerScopeIndex()");
          if (!bVar3) goto LAB_0077907d;
          *puVar4 = 0;
        }
        FuncInfo::ReleaseInnerScopeIndex(this);
      }
    }
    if (byteCodeGenerator->currentScope != pSVar1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x84,"(byteCodeGenerator->GetCurrentScope() == scope)",
                         "byteCodeGenerator->GetCurrentScope() == scope");
      if (!bVar3) {
LAB_0077907d:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    ByteCodeGenerator::PopScope(byteCodeGenerator);
    byteCodeGenerator->currentBlock = byteCodeGenerator->currentBlock->enclosingBlock;
  }
  return;
}

Assistant:

void EndVisitBlock(ParseNodeBlock *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    if (BlockHasOwnScope(pnode, byteCodeGenerator))
    {
        Scope *scope = pnode->scope;
        FuncInfo *func = scope->GetFunc();

        if (!(byteCodeGenerator->IsInDebugMode() || func->byteCodeFunction->IsCoroutine())
            && scope->HasInnerScopeIndex())
        {
            // In debug mode (or for the generator/async function), don't release the current index, as we're giving each scope a unique index, regardless
            // of nesting.
            Assert(scope->GetInnerScopeIndex() == func->CurrentInnerScopeIndex());
            func->ReleaseInnerScopeIndex();
        }

        Assert(byteCodeGenerator->GetCurrentScope() == scope);
        byteCodeGenerator->PopScope();
        byteCodeGenerator->PopBlock();
    }
}